

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O0

string * __thiscall
WindowsPath::ToString_abi_cxx11_(string *__return_storage_ptr__,WindowsPath *this)

{
  bool bVar1;
  size_type sVar2;
  reference pbVar3;
  ostream *poVar4;
  _Self local_1c0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  const_iterator it;
  stringstream local_1a0 [8];
  stringstream pathStream;
  ostream local_190 [376];
  WindowsPath *local_18;
  WindowsPath *this_local;
  
  local_18 = this;
  this_local = (WindowsPath *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator!=(&this->mDriveLetter,"");
  if (bVar1) {
    poVar4 = std::operator<<(local_190,(string *)this);
    std::operator<<(poVar4,":\\");
  }
  sVar2 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->mPathComponents);
  if (sVar2 != 0) {
    local_1b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->mPathComponents);
    pbVar3 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_1b8);
    std::operator<<(local_190,(string *)pbVar3);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1b8);
    while( true ) {
      local_1c0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->mPathComponents);
      bVar1 = std::operator!=(&local_1b8,&local_1c0);
      if (!bVar1) break;
      poVar4 = std::operator<<(local_190,"\\");
      pbVar3 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_1b8);
      std::operator<<(poVar4,(string *)pbVar3);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_1b8);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string WindowsPath::ToString() const
{
	stringstream pathStream;
    
	if(mDriveLetter != "")
		pathStream<<mDriveLetter<<":\\";
    
	if(mPathComponents.size() > 0)
	{
		StringList::const_iterator it = mPathComponents.begin();
		pathStream<<*it;
		++it;
        
		for(; it != mPathComponents.end();++it)
			pathStream<<"\\"<<*it;
	}
    
	return pathStream.str();
}